

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsInput
helicsFederateRegisterGlobalTypeInput
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *puVar2;
  string_view units_00;
  ulong uVar3;
  ValueFederate *pVVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  Input *pIVar7;
  ulong uVar8;
  const_iterator __position;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  InputObject *pIVar11;
  FedObject *fedObj;
  string_view name;
  string_view type_00;
  __single_object inp;
  _Head_base<0UL,_helics::InputObject_*,_false> local_70;
  InputObject *local_68;
  size_type local_60;
  ValueFederate *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  HelicsError *local_48;
  size_t local_40;
  char *pcStack_38;
  
  local_48 = err;
  getValueFedSharedPtr(&local_58,(HelicsError *)fed);
  pVVar4 = local_58;
  if (local_58 == (ValueFederate *)0x0) {
    pIVar11 = (InputObject *)0x0;
  }
  else {
    local_68 = (InputObject *)operator_new(0x20);
    (local_68->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68->inputPtr = (Input *)0x0;
    *(undefined8 *)local_68 = 0;
    (local_68->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_60 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var9 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (key != (char *)0x0) {
      local_60 = strlen(key);
      _Var9._M_p = key;
    }
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var10._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (type != (char *)0x0) {
      sVar6 = strlen(type);
      _Var10._M_p = type;
    }
    local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    pcStack_38 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (units != (char *)0x0) {
      local_40 = strlen(units);
      pcStack_38 = units;
    }
    units_00._M_str = pcStack_38;
    units_00._M_len = local_40;
    name._M_str = _Var9._M_p;
    name._M_len = local_60;
    type_00._M_str = _Var10._M_p;
    type_00._M_len = sVar6;
    pIVar7 = helics::ValueFederate::registerGlobalInput(pVVar4,name,type_00,units_00);
    p_Var5 = p_Stack_50;
    pVVar4 = local_58;
    local_68->inputPtr = pIVar7;
    local_58 = (ValueFederate *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_68->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_68->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pVVar4;
    (local_68->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    pIVar11 = local_68;
    local_70._M_head_impl = local_68;
    local_68 = (InputObject *)0x0;
    pIVar11->valid = 0x3456e052;
    __position._M_current =
         *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
          ((long)fed + 0x50);
    puVar2 = *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
              ((long)fed + 0x58);
    if ((__position._M_current == puVar2) ||
       (iVar1 = (pIVar11->inputPtr->super_Interface).handle.hid,
       ((puVar2[-1]._M_t.
         super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>._M_t.
         super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
         super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
       super_Interface).handle.hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
      ::emplace_back<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>
                ((vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
                  *)((long)fed + 0x50),
                 (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                 &local_70);
    }
    else {
      uVar8 = (long)puVar2 - (long)__position._M_current >> 3;
      while (uVar3 = uVar8, 0 < (long)uVar3) {
        uVar8 = uVar3 >> 1;
        if (((__position._M_current[uVar8]._M_t.
              super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>.
              _M_t.
              super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
              .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
            super_Interface).handle.hid <= iVar1) {
          __position._M_current = __position._M_current + uVar8 + 1;
          uVar8 = ~uVar8 + uVar3;
        }
      }
      std::
      vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
                        *)((long)fed + 0x50),__position,(value_type *)&local_70);
    }
    if (local_70._M_head_impl != (InputObject *)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_70,local_70._M_head_impl);
    }
    local_70._M_head_impl = (InputObject *)0x0;
    if (local_68 != (InputObject *)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_68,local_68);
    }
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return pIVar11;
}

Assistant:

HelicsInput
    helicsFederateRegisterGlobalTypeInput(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto inp = std::make_unique<helics::InputObject>();
        inp->inputPtr = &(fedObj->registerGlobalInput(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units)));
        inp->fedptr = std::move(fedObj);
        return addInput(fed, std::move(inp));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}